

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::PRE::FindPossiblePRECandidates(PRE *this,Loop *loop,JitArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  BasicBlock *pBVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  PRECandidates *pPVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_48;
  PRE *local_38;
  
  local_38 = this;
  pBVar3 = Loop::GetHeadBlock(loop);
  pSVar7 = &(pBVar3->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_48.list = pSVar7;
  local_48.current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pPVar6 = (PRECandidates *)0x0;
  do {
    if (pSVar7 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_0044072d;
      *puVar4 = 0;
      pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    }
    local_48.current =
         (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
          &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>)->
         super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
        local_48.list) {
      local_38->candidates = pPVar6;
      return;
    }
    ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_48);
    pBVar3 = (*ppFVar5)->predBlock;
    if (pBVar3 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3b2,"(blockPred)","blockPred");
      if (!bVar2) {
LAB_0044072d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Loop::IsDescendentOrSelf(loop,pBVar3->loop);
    pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    if (bVar2) {
      pPVar6 = FindBackEdgePRECandidates(local_38->globOpt,pBVar3,alloc);
      pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
    }
  } while( true );
}

Assistant:

void GlobOpt::PRE::FindPossiblePRECandidates(Loop *loop, JitArenaAllocator *alloc)
{
    // Find the set of PRE candidates
    BasicBlock *loopHeader = loop->GetHeadBlock();
    PRECandidates *candidates = nullptr;
    bool firstBackEdge = true;

    FOREACH_PREDECESSOR_BLOCK(blockPred, loopHeader)
    {
        if (!loop->IsDescendentOrSelf(blockPred->loop))
        {
            // Not a loop back-edge
            continue;
        }
        if (firstBackEdge)
        {
            candidates = this->globOpt->FindBackEdgePRECandidates(blockPred, alloc);
        }
        else
        {
            blockPred->globOptData.RemoveUnavailableCandidates(candidates);
        }
    } NEXT_PREDECESSOR_BLOCK;

    this->candidates = candidates;
}